

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void anon_unknown.dwarf_5292d::import_arg_group_global(void)

{
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"profile",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,"Vorpaline mode (scan, convert, repair, heal, cad, tet, poly, hex, quad)",
             &local_61);
  GEO::CmdLine::declare_arg((string *)local_28,"scan",(string *)local_60,ARG_FLAGS_DEFAULT);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"debug",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Toggles debug mode",&local_b1);
  GEO::CmdLine::declare_arg((string *)local_88,false,(string *)local_b0,ARG_ADVANCED);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return;
}

Assistant:

void import_arg_group_global() {
        declare_arg(
            "profile", "scan",
            "Vorpaline mode "
	    "(scan, convert, repair, heal, cad, tet, poly, hex, quad)"
        );
        declare_arg(
            "debug", false,
            "Toggles debug mode", ARG_ADVANCED
        );
    }